

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

Gia_Man_t * Nf_ManPerformMapping(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  Vec_Flt_t *p;
  int iVar1;
  int iVar2;
  Nf_Man_t *p_00;
  Gia_Obj_t *pGVar3;
  Scl_Con_t *pSVar4;
  word wVar5;
  ulong uVar6;
  Gia_Man_t *pGVar7;
  char *pTitle;
  float fVar8;
  float fVar9;
  
  pGVar7 = pGia;
  if (pGia->pSibls == (int *)0x0) {
    if (pPars->fCoarsen != 0) {
      pGVar7 = Gia_ManDupMuxes(pGia,pPars->nCoarseLimit);
    }
  }
  else {
    pPars->fCoarsen = 0;
  }
  p_00 = Nf_StoCreate(pGVar7,pPars);
  if ((pPars->fVerbose != 0) && (pPars->fCoarsen != 0)) {
    printf("Initial ");
    Gia_ManPrintMuxStats(pGia);
    putchar(10);
    printf("Derived ");
    Gia_ManPrintMuxStats(pGVar7);
    putchar(10);
  }
  Nf_ManPrintInit(p_00);
  Nf_ManComputeCuts(p_00);
  Nf_ManPrintQuit(p_00);
  iVar1 = Scl_ConIsRunning();
  if (iVar1 == 0) {
    for (iVar1 = 0; pGVar7 = p_00->pGia, iVar1 < pGVar7->vCis->nSize; iVar1 = iVar1 + 1) {
      pGVar3 = Gia_ManCi(pGVar7,iVar1);
      iVar2 = Gia_ObjId(pGVar7,pGVar3);
      if (iVar2 == 0) break;
      p = p_00->pGia->vInArrs;
      if (p == (Vec_Flt_t *)0x0) {
        wVar5 = 0;
      }
      else {
        fVar8 = Vec_FltEntry(p,iVar1);
        fVar9 = 0.0;
        if (0.0 <= fVar8) {
          fVar9 = fVar8;
        }
        uVar6 = (ulong)(fVar9 * 1000.0);
        wVar5 = (long)(fVar9 * 1000.0 - 9.223372e+18) & (long)uVar6 >> 0x3f | uVar6;
      }
      Nf_ObjPrepareCi(p_00,iVar2,wVar5);
    }
  }
  else {
    for (iVar1 = 0; pGVar7 = p_00->pGia, iVar1 < pGVar7->vCis->nSize; iVar1 = iVar1 + 1) {
      pGVar3 = Gia_ManCi(pGVar7,iVar1);
      iVar2 = Gia_ObjId(pGVar7,pGVar3);
      if (iVar2 == 0) break;
      pSVar4 = Scl_ConReadMan();
      wVar5 = Vec_WrdEntry(&pSVar4->vInArrs,iVar1);
      Nf_ObjPrepareCi(p_00,iVar2,wVar5);
    }
  }
  iVar1 = 0;
  while( true ) {
    p_00->Iter = iVar1;
    iVar2 = p_00->pPars->nRounds;
    if (iVar2 <= iVar1) break;
    Nf_ManComputeMapping(p_00);
    Nf_ManSetMapRefs(p_00);
    pTitle = "Area ";
    if (p_00->Iter == 0) {
      pTitle = "Delay";
    }
    Nf_ManPrintStats(p_00,pTitle);
    iVar1 = p_00->Iter + 1;
  }
  p_00->fUseEla = 1;
  while (iVar1 < iVar2 + pPars->nRoundsEla) {
    Nf_ManComputeMappingEla(p_00);
    Nf_ManUpdateStats(p_00);
    Nf_ManPrintStats(p_00,"Ela  ");
    iVar1 = p_00->Iter + 1;
    p_00->Iter = iVar1;
    iVar2 = p_00->pPars->nRounds;
  }
  pGVar7 = Nf_ManDeriveMapping(p_00);
  Nf_StoDelete(p_00);
  return pGVar7;
}

Assistant:

Gia_Man_t * Nf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Gia_Man_t * pNew = NULL, * pCls;
    Nf_Man_t * p; int i, Id;
    if ( Gia_ManHasChoices(pGia) )
        pPars->fCoarsen = 0; 
    pCls = pPars->fCoarsen ? Gia_ManDupMuxes(pGia, pPars->nCoarseLimit) : pGia;
    p = Nf_StoCreate( pCls, pPars );
//    if ( pPars->fVeryVerbose )
//        Nf_StoPrint( p, pPars->fVeryVerbose );
    if ( pPars->fVerbose && pPars->fCoarsen )
    {
        printf( "Initial " );  Gia_ManPrintMuxStats( pGia );  printf( "\n" );
        printf( "Derived " );  Gia_ManPrintMuxStats( pCls );  printf( "\n" );
    }
    Nf_ManPrintInit( p );
    Nf_ManComputeCuts( p );
    Nf_ManPrintQuit( p );
    if ( Scl_ConIsRunning() )
    {
        Gia_ManForEachCiId( p->pGia, Id, i )
            Nf_ObjPrepareCi( p, Id, Scl_ConGetInArr(i) );
    }
    else
    {
        Gia_ManForEachCiId( p->pGia, Id, i )
            Nf_ObjPrepareCi( p, Id, Nf_Flt2Wrd(p->pGia->vInArrs ? Abc_MaxFloat(0.0, Vec_FltEntry(p->pGia->vInArrs, i)) : 0.0) );
    }
    for ( p->Iter = 0; p->Iter < p->pPars->nRounds; p->Iter++ )
    {
        Nf_ManComputeMapping( p );
        Nf_ManSetMapRefs( p );
        Nf_ManPrintStats( p, (char *)(p->Iter ? "Area " : "Delay") );
    }

    p->fUseEla = 1;
    for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla; p->Iter++ )
    {
        Nf_ManComputeMappingEla( p );
        Nf_ManUpdateStats( p );
        Nf_ManPrintStats( p, "Ela  " );
    }
    pNew = Nf_ManDeriveMapping( p );
    Nf_StoDelete( p );
    return pNew;
}